

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

xmlAutomataStatePtr
xmlAutomataNewNegTrans
          (xmlAutomataPtr am,xmlAutomataStatePtr from,xmlAutomataStatePtr to,xmlChar *token,
          xmlChar *token2,void *data)

{
  int iVar1;
  int iVar2;
  xmlRegAtomPtr atom_00;
  xmlChar *pxVar3;
  size_t sVar4;
  void *__dest;
  xmlChar *str;
  int lenp;
  int lenn;
  xmlChar err_msg [200];
  xmlRegAtomPtr atom;
  void *data_local;
  xmlChar *token2_local;
  xmlChar *token_local;
  xmlAutomataStatePtr to_local;
  xmlAutomataStatePtr from_local;
  xmlAutomataPtr am_local;
  
  if (((am == (xmlAutomataPtr)0x0) || (from == (xmlAutomataStatePtr)0x0)) ||
     (token == (xmlChar *)0x0)) {
    am_local = (xmlAutomataPtr)0x0;
  }
  else {
    atom_00 = xmlRegNewAtom(am,XML_REGEXP_STRING);
    if (atom_00 == (xmlRegAtomPtr)0x0) {
      am_local = (xmlAutomataPtr)0x0;
    }
    else {
      atom_00->data = data;
      atom_00->neg = 1;
      if ((token2 == (xmlChar *)0x0) || (*token2 == '\0')) {
        pxVar3 = xmlStrdup(token);
        atom_00->valuep = pxVar3;
      }
      else {
        sVar4 = strlen((char *)token2);
        iVar2 = (int)sVar4;
        sVar4 = strlen((char *)token);
        iVar1 = (int)sVar4;
        __dest = (*xmlMalloc)((long)(iVar2 + iVar1 + 2));
        if (__dest == (void *)0x0) {
          xmlRegFreeAtom(atom_00);
          return (xmlAutomataStatePtr)0x0;
        }
        memcpy(__dest,token,(long)iVar1);
        *(undefined1 *)((long)__dest + (long)iVar1) = 0x7c;
        memcpy((void *)((long)__dest + (long)(iVar1 + 1)),token2,(long)iVar2);
        *(undefined1 *)((long)__dest + (long)(iVar2 + iVar1 + 1)) = 0;
        atom_00->valuep = __dest;
      }
      snprintf((char *)&lenp,199,"not %s",atom_00->valuep);
      err_msg[0xbf] = '\0';
      pxVar3 = xmlStrdup((xmlChar *)&lenp);
      atom_00->valuep2 = pxVar3;
      iVar2 = xmlFAGenerateTransitions(am,from,to,atom_00);
      if (iVar2 < 0) {
        xmlRegFreeAtom(atom_00);
        am_local = (xmlAutomataPtr)0x0;
      }
      else {
        am->negs = am->negs + 1;
        am_local = (xmlAutomataPtr)to;
        if (to == (xmlAutomataStatePtr)0x0) {
          am_local = (xmlAutomataPtr)am->state;
        }
      }
    }
  }
  return (xmlAutomataStatePtr)am_local;
}

Assistant:

xmlAutomataStatePtr
xmlAutomataNewNegTrans(xmlAutomataPtr am, xmlAutomataStatePtr from,
		       xmlAutomataStatePtr to, const xmlChar *token,
		       const xmlChar *token2, void *data) {
    xmlRegAtomPtr atom;
    xmlChar err_msg[200];

    if ((am == NULL) || (from == NULL) || (token == NULL))
	return(NULL);
    atom = xmlRegNewAtom(am, XML_REGEXP_STRING);
    if (atom == NULL)
	return(NULL);
    atom->data = data;
    atom->neg = 1;
    if ((token2 == NULL) || (*token2 == 0)) {
	atom->valuep = xmlStrdup(token);
    } else {
	int lenn, lenp;
	xmlChar *str;

	lenn = strlen((char *) token2);
	lenp = strlen((char *) token);

	str = xmlMalloc(lenn + lenp + 2);
	if (str == NULL) {
	    xmlRegFreeAtom(atom);
	    return(NULL);
	}
	memcpy(&str[0], token, lenp);
	str[lenp] = '|';
	memcpy(&str[lenp + 1], token2, lenn);
	str[lenn + lenp + 1] = 0;

	atom->valuep = str;
    }
    snprintf((char *) err_msg, 199, "not %s", (const char *) atom->valuep);
    err_msg[199] = 0;
    atom->valuep2 = xmlStrdup(err_msg);

    if (xmlFAGenerateTransitions(am, from, to, atom) < 0) {
        xmlRegFreeAtom(atom);
	return(NULL);
    }
    am->negs++;
    if (to == NULL)
	return(am->state);
    return(to);
}